

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_private.h
# Opt level: O0

int amqp_decode_32(amqp_bytes_t encoded,size_t *offset,uint32_t *output)

{
  uint32_t uVar1;
  ulong uVar2;
  uint32_t *in_RCX;
  size_t *in_RDX;
  void *in_RSI;
  ulong in_RDI;
  size_t o;
  void *data;
  uint local_4;
  
  data = (void *)*in_RDX;
  uVar2 = (long)data + 4;
  *in_RDX = uVar2;
  if (uVar2 <= in_RDI) {
    amqp_offset(in_RSI,(size_t)data);
    uVar1 = amqp_d32(data);
    *in_RCX = uVar1;
  }
  local_4 = (uint)(uVar2 <= in_RDI);
  return local_4;
}

Assistant:

static inline int amqp_encode_bytes(amqp_bytes_t encoded, size_t *offset,
                                    amqp_bytes_t input) {
  size_t o = *offset;
  /* The memcpy below has undefined behavior if the input is NULL. It is valid
   * for a 0-length amqp_bytes_t to have .bytes == NULL. Thus we should check
   * before encoding.
   */
  if (input.len == 0) {
    return 1;
  }
  if ((*offset = o + input.len) <= encoded.len) {
    memcpy(amqp_offset(encoded.bytes, o), input.bytes, input.len);
    return 1;
  } else {
    return 0;
  }
}